

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O3

void kernel_to_references<float,unsigned_long>
               (TreesIndexer *indexer,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               float *numeric_data,int *categ_data,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,bool is_col_major,size_t ld_numeric,size_t ld_categ,
               size_t nrows,int nthreads,double *rmat,bool standardize)

{
  pointer pSVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  unsigned_long *Xc_indptr_00;
  ulong uVar5;
  unsigned_long *tree_num;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  float *Xc_00;
  unsigned_long *Xc_ind_00;
  float *Xr_indptr;
  size_t sVar11;
  bool bVar12;
  pointer __old_p;
  SignalSwitcher local_78;
  long local_68;
  size_t local_60;
  float *local_58;
  int *local_50;
  ExtIsoForest *local_48;
  pointer local_40;
  pointer local_38;
  
  local_38 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar8 = ((long)local_40 - (long)local_38 >> 3) * -0x79435e50d79435e5;
  local_60 = (long)(local_38->reference_points).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_38->reference_points).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  bVar12 = !handle_is_locked;
  local_58 = numeric_data;
  local_50 = categ_data;
  local_48 = model_outputs_ext;
  if (bVar12) {
    handle_is_locked = true;
    interrupt_switch = false;
    local_78.old_sig = (sig_t_)signal(2,set_interrup_global_variable);
  }
  uVar5 = lVar8 * nrows;
  local_78.is_active = bVar12;
  tree_num = (unsigned_long *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
  uVar5 = 0xffffffffffffffff;
  if (nrows < 0x2000000000000000) {
    uVar5 = nrows * 8;
  }
  pdVar6 = (double *)operator_new__(uVar5);
  pfVar10 = (float *)0x0;
  Xc_00 = (float *)0x0;
  if (is_col_major) {
    Xc_00 = Xc;
  }
  Xc_ind_00 = (unsigned_long *)0x0;
  if (is_col_major) {
    Xc_ind_00 = Xc_ind;
  }
  Xr_indptr = (float *)Xc_indptr;
  Xc_indptr_00 = (unsigned_long *)0x0;
  if (is_col_major) {
    Xr_indptr = pfVar10;
    Xc = pfVar10;
    Xc_indptr_00 = Xc_indptr;
    Xc_ind = (unsigned_long *)pfVar10;
  }
  local_68 = lVar8;
  predict_iforest<float,unsigned_long>
            (local_58,local_50,is_col_major,ld_numeric,ld_categ,Xc_00,Xc_ind_00,Xc_indptr_00,Xc,
             Xc_ind,(unsigned_long *)Xr_indptr,nrows,nthreads,false,model_outputs,local_48,pdVar6,
             tree_num,(double *)0x0,indexer);
  operator_delete__(pdVar6);
  check_interrupt_switch(&local_78);
  bVar12 = interrupt_switch;
  lVar8 = (long)local_60 >> 3;
  if (nrows != 0) {
    pSVar1 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = local_68 + (ulong)(local_68 == 0);
    sVar11 = 0;
    do {
      if (bVar12 == false) {
        pdVar6 = rmat + sVar11 * lVar8;
        memset(pdVar6,0,local_60);
        if (local_40 != local_38) {
          lVar7 = 0;
          do {
            lVar2 = *(long *)&pSVar1[lVar7].reference_indptr.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
            uVar5 = *(ulong *)(lVar2 + tree_num[sVar11 + lVar7 * nrows] * 8);
            uVar3 = *(ulong *)(lVar2 + 8 + tree_num[sVar11 + lVar7 * nrows] * 8);
            if (uVar5 < uVar3) {
              lVar2 = *(long *)&pSVar1[lVar7].reference_mapping.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl;
              do {
                lVar4 = *(long *)(lVar2 + uVar5 * 8);
                pdVar6[lVar4] = pdVar6[lVar4] + 1.0;
                uVar5 = uVar5 + 1;
              } while (uVar3 != uVar5);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar9);
        }
      }
      sVar11 = sVar11 + 1;
    } while (sVar11 != nrows);
  }
  check_interrupt_switch(&local_78);
  if ((standardize) && (lVar8 = lVar8 * nrows, lVar8 != 0)) {
    lVar9 = 0;
    do {
      rmat[lVar9] = rmat[lVar9] /
                    (((double)CONCAT44(0x45300000,(int)((ulong)local_68 >> 0x20)) -
                     1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0));
      lVar9 = lVar9 + 1;
    } while (lVar8 - lVar9 != 0);
  }
  check_interrupt_switch(&local_78);
  operator_delete__(tree_num);
  if ((local_78.is_active == true) && (handle_is_locked == true)) {
    interrupt_switch = false;
    signal(2,(__sighandler_t)local_78.old_sig);
    handle_is_locked = false;
  }
  return;
}

Assistant:

void kernel_to_references(TreesIndexer &indexer,
                          IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          size_t nrows, int nthreads,
                          double *restrict rmat,
                          bool standardize)
{
    size_t ntrees = indexer.indices.size();
    size_t n_ref = indexer.indices.front().reference_points.size();

    SignalSwitcher ss;

    std::unique_ptr<sparse_ix[]> terminal_indices(new sparse_ix[nrows*ntrees]);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    is_col_major? Xc : nullptr, is_col_major? Xc_ind : nullptr, is_col_major? Xc_indptr : nullptr,
                    is_col_major? (real_t*)nullptr : Xc, is_col_major? (sparse_ix*)nullptr : Xc_ind, is_col_major? (sparse_ix*)nullptr : Xc_indptr,
                    nrows, nthreads, false,
                    model_outputs, model_outputs_ext,
                    ignored.get(), terminal_indices.get(),
                    (double*)NULL,
                    &indexer);
    ignored.reset();

    check_interrupt_switch(ss);

    #pragma omp parallel for schedule(static) num_threads(nthreads) \
            shared(indexer, terminal_indices, nrows, ntrees, n_ref, rmat)
    for (size_t_for row = 0; row < (decltype(row))nrows; row++)
    {
        if (interrupt_switch) continue;

        SingleTreeIndex *restrict index_node;
        size_t idx_this;
        sparse_ix *restrict terminal_indices_this = terminal_indices.get() + row;
        double *restrict rmat_this = rmat + row*n_ref;
        memset(rmat_this, 0, n_ref*sizeof(double));

        for (size_t tree = 0; tree < ntrees; tree++)
        {
            idx_this = terminal_indices_this[tree*nrows];
            index_node = &indexer.indices[tree];
            for (size_t ind = index_node->reference_indptr[idx_this];
                 ind < index_node->reference_indptr[idx_this + 1];
                 ind++)
            {
                rmat_this[index_node->reference_mapping[ind]]++;
            }
        }
    }

    check_interrupt_switch(ss);

    if (standardize)
    {
        double ntrees_dbl = (double)ntrees;
        for (size_t ix = 0; ix < nrows*n_ref; ix++)
            rmat[ix] /= ntrees_dbl;
    }

    check_interrupt_switch(ss);
}